

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O2

cupdlp_dcs * cupdlp_dcs_transpose(cupdlp_dcs *A,int values)

{
  uint m;
  int iVar1;
  int *piVar2;
  int *piVar3;
  double *pdVar4;
  int *p;
  int *piVar5;
  double *pdVar6;
  cupdlp_dcs *pcVar7;
  int *c;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  if ((A != (cupdlp_dcs *)0x0) && (A->nz == -1)) {
    iVar10 = A->m;
    m = A->n;
    piVar2 = A->p;
    piVar3 = A->i;
    pdVar4 = A->x;
    pcVar7 = cupdlp_dcs_spalloc(m,iVar10,piVar2[(int)m],
                                (uint)(pdVar4 != (double *)0x0 && values != 0),0);
    c = (int *)calloc((long)iVar10,4);
    if (pcVar7 == (cupdlp_dcs *)0x0 || c == (int *)0x0) {
      iVar10 = 0;
    }
    else {
      p = pcVar7->p;
      piVar5 = pcVar7->i;
      pdVar6 = pcVar7->x;
      iVar1 = piVar2[(int)m];
      for (lVar11 = 0; lVar11 < iVar1; lVar11 = lVar11 + 1) {
        c[piVar3[lVar11]] = c[piVar3[lVar11]] + 1;
      }
      cupdlp_dcs_cumsum(p,c,iVar10);
      uVar8 = 0;
      uVar12 = (ulong)m;
      if ((int)m < 1) {
        uVar12 = uVar8;
      }
      while (uVar9 = uVar8, uVar9 != uVar12) {
        for (lVar11 = (long)piVar2[uVar9]; uVar8 = uVar9 + 1, lVar11 < piVar2[uVar9 + 1];
            lVar11 = lVar11 + 1) {
          iVar10 = piVar3[lVar11];
          iVar1 = c[iVar10];
          c[iVar10] = iVar1 + 1;
          piVar5[iVar1] = (int)uVar9;
          if (pdVar6 != (double *)0x0) {
            pdVar6[iVar1] = pdVar4[lVar11];
          }
        }
      }
      iVar10 = 1;
    }
    pcVar7 = cupdlp_dcs_done(pcVar7,c,(void *)0x0,iVar10);
    return pcVar7;
  }
  return (cupdlp_dcs *)0x0;
}

Assistant:

cupdlp_dcs *cupdlp_dcs_transpose(const cupdlp_dcs *A, int values) {
  cupdlp_int p, q, j, *Cp, *Ci, n, m, *Ap, *Ai, *w;
  double *Cx, *Ax;
  cupdlp_dcs *C;
  if (!IS_CSC(A)) return (NULL); /* check inputs */
  m = A->m;
  n = A->n;
  Ap = A->p;
  Ai = A->i;
  Ax = A->x;
  C = cupdlp_dcs_spalloc(n, m, Ap[n], values && Ax, 0);  /* allocate result */
  w = cupdlp_calloc(m, sizeof(cupdlp_int));              /* get workspace */
  if (!C || !w) return (cupdlp_dcs_done(C, w, NULL, 0)); /* out of memory */
  Cp = C->p;
  Ci = C->i;
  Cx = C->x;
  for (p = 0; p < Ap[n]; p++) w[Ai[p]]++; /* row counts */
  cupdlp_dcs_cumsum(Cp, w, m);            /* row pointers */
  for (j = 0; j < n; j++) {
    for (p = Ap[j]; p < Ap[j + 1]; p++) {
      Ci[q = w[Ai[p]]++] = j; /* place A(i,j) as entry C(j,i) */
      if (Cx) Cx[q] = Ax[p];
    }
  }
  return (cupdlp_dcs_done(C, w, NULL, 1)); /* success; free w and return C */
}